

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O0

void __thiscall glcts::TessellationShadersIsolines::initTest(TessellationShadersIsolines *this)

{
  int iVar1;
  GLenum GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TessellationShaderUtils *this_01;
  mapped_type *this_02;
  undefined1 local_d8 [8];
  _test_descriptor test;
  int n_vs_mode;
  int n_vs_modes;
  _tessellation_shader_vertex_spacing_conflict vs_modes [3];
  _tessellation_shader_vertex_spacing_conflict vertex_spacing_mode;
  float outer_tess_levels [4];
  float local_80;
  uint local_7c;
  float inner_tess_levels [2];
  uint other_tess_level_index;
  uint outer2_tess_level_index;
  uint outer1_tess_level_index;
  uint n_tess_levels;
  GLfloat tess_levels [4];
  GLint gl_max_tess_gen_level_value;
  allocator<char> local_39;
  string local_38;
  Functions *local_18;
  Functions *gl;
  TessellationShadersIsolines *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = (Functions *)CONCAT44(extraout_var,iVar1);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Tessellation shader functionality not supported, skipping",
               &local_39);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  this_01 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_01,local_18,&this->super_TestCaseBase);
  this->m_utils_ptr = this_01;
  (*local_18->genVertexArrays)(1,&this->m_vao_id);
  GVar2 = (*local_18->getError)();
  glu::checkError(GVar2,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x22a);
  (*local_18->bindVertexArray)(this->m_vao_id);
  GVar2 = (*local_18->getError)();
  glu::checkError(GVar2,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x22d);
  tess_levels[3] = 0.0;
  (*local_18->getIntegerv)
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,(GLint *)(tess_levels + 3))
  ;
  GVar2 = (*local_18->getError)();
  glu::checkError(GVar2,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x233);
  outer1_tess_level_index = 0xbf800000;
  n_tess_levels = 0x40800000;
  tess_levels[0] = (float)(int)tess_levels[3] * 0.5;
  tess_levels[1] = (float)(int)tess_levels[3];
  this->m_irrelevant_tess_value_1 = -1.0;
  this->m_irrelevant_tess_value_2 = 4.0;
  for (other_tess_level_index = 0; other_tess_level_index < 4;
      other_tess_level_index = other_tess_level_index + 1) {
    for (inner_tess_levels[1] = 0.0; (uint)inner_tess_levels[1] < 4;
        inner_tess_levels[1] = (float)((int)inner_tess_levels[1] + 1)) {
      for (inner_tess_levels[0] = 0.0; (uint)inner_tess_levels[0] < 2;
          inner_tess_levels[0] = (float)((int)inner_tess_levels[0] + 1)) {
        local_80 = (float)(&outer1_tess_level_index)[(uint)inner_tess_levels[0]];
        local_7c = (&outer1_tess_level_index)[(uint)inner_tess_levels[0]];
        vs_modes[2] = (&outer1_tess_level_index)[other_tess_level_index];
        _n_vs_mode = 0x100000000;
        vs_modes[0] = TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES;
        test.vertex_spacing_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
        for (test.outer_tess_levels[3] = 0.0; (int)test.outer_tess_levels[3] < 3;
            test.outer_tess_levels[3] = (float)((int)test.outer_tess_levels[3] + 1)) {
          vs_modes[1] = (&n_vs_mode)[(int)test.outer_tess_levels[3]];
          _test_descriptor::_test_descriptor((_test_descriptor *)local_d8);
          initTestDescriptor(this,vs_modes[1],&local_80,(float *)(vs_modes + 2),
                             (float)(&outer1_tess_level_index)[(uint)inner_tess_levels[0]],
                             (_test_descriptor *)local_d8);
          this_02 = std::
                    map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>_>
                    ::operator[](&this->m_tests,vs_modes + 1);
          std::
          vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>
          ::push_back(this_02,(value_type *)local_d8);
        }
      }
    }
  }
  return;
}

Assistant:

void TessellationShadersIsolines::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Generate Utilities instance */
	m_utils_ptr = new TessellationShaderUtils(gl, this);

	/* Set up vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Initialize reference tessellation values */
	const glw::GLfloat tess_levels[] = { -1.0f, 4.0f, float(gl_max_tess_gen_level_value) * 0.5f,
										 float(gl_max_tess_gen_level_value) };
	const unsigned int n_tess_levels = sizeof(tess_levels) / sizeof(tess_levels[0]);

	m_irrelevant_tess_value_1 = tess_levels[0];
	m_irrelevant_tess_value_2 = tess_levels[1];

	/* Initialize all test passes.
	 *
	 * Make sure each relevant outer tessellation level iterates through values
	 * of our interest
	 */
	for (unsigned int outer1_tess_level_index = 0; outer1_tess_level_index < n_tess_levels; ++outer1_tess_level_index)
	{
		for (unsigned int outer2_tess_level_index = 0; outer2_tess_level_index < n_tess_levels;
			 ++outer2_tess_level_index)
		{
			/* To make the test execute in a reasonable time frame, just use
			 * two different levels for the outer tessellation levels */
			DE_STATIC_ASSERT(n_tess_levels >= 2);

			for (unsigned int other_tess_level_index = 0; other_tess_level_index < 2 /* see comment */;
				 ++other_tess_level_index)
			{
				float inner_tess_levels[2] = { tess_levels[other_tess_level_index],
											   tess_levels[other_tess_level_index] };
				float outer_tess_levels[4] = { tess_levels[outer1_tess_level_index],
											   tess_levels[outer2_tess_level_index],
											   tess_levels[other_tess_level_index],
											   tess_levels[other_tess_level_index] };

				/* Finally, iterate over three vertex spacing modes */
				_tessellation_shader_vertex_spacing vertex_spacing_mode;

				const _tessellation_shader_vertex_spacing vs_modes[] = {
					TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
					TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD
				};
				const int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

				for (int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
				{
					vertex_spacing_mode = vs_modes[n_vs_mode];

					_test_descriptor test;

					initTestDescriptor(vertex_spacing_mode, inner_tess_levels, outer_tess_levels,
									   tess_levels[other_tess_level_index], test);

					m_tests[vertex_spacing_mode].push_back(test);
				} /* for (all available vertex spacing modes) */
			}	 /* for (all irrelevant tessellation levels) */
		}		  /* for (all defined second outer tessellation levels) */
	}			  /* for (all defined first outer tessellation levels) */
}